

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall
QFileDialogPrivate::itemNotFound(QFileDialogPrivate *this,QString *fileName,FileMode mode)

{
  QWidget *this_00;
  char *s;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  s = "%1\nFile not found.\nPlease verify the correct file name was given.";
  if (mode == Directory) {
    s = "%1\nDirectory not found.\nPlease verify the correct directory name was given.";
  }
  QFileDialog::tr((QString *)&local_48,s,(char *)0x0,-1);
  QWidget::windowTitle((QString *)&local_60,this_00);
  QString::arg<QString,_true>((QString *)&QStack_78,(QString *)&local_48,fileName,0,(QChar)0x20);
  QMessageBox::warning
            (this_00,(QString *)&local_60,(QString *)&QStack_78,(StandardButtons)0x400,NoButton);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::itemNotFound(const QString &fileName, QFileDialog::FileMode mode)
{
#if QT_CONFIG(messagebox)
    Q_Q(QFileDialog);
    const QString message = mode == QFileDialog::Directory
            ? QFileDialog::tr("%1\nDirectory not found.\n"
                              "Please verify the correct directory name was given.")
            : QFileDialog::tr("%1\nFile not found.\nPlease verify the "
                              "correct file name was given.");

    QMessageBox::warning(q, q->windowTitle(), message.arg(fileName));
#endif // QT_CONFIG(messagebox)
}